

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O2

void __thiscall mp::PLPoints::~PLPoints(PLPoints *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->y_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

bool empty() const { return x_.empty(); }